

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O3

int get_item_for_cursor(coda_tree_node *node,int depth,coda_cursor *cursor,void **item)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (node == (coda_tree_node *)0x0) {
LAB_00160e18:
    pvVar2 = (void *)0x0;
  }
  else {
    if (depth < cursor->n + -1) {
      if (0 < node->num_indexed_children) {
        lVar1 = cursor->stack[depth + 1].index;
        uVar3 = node->num_indexed_children - 1;
        if (uVar3 == 0) {
          uVar5 = 0;
        }
        else {
          uVar6 = 0;
          uVar4 = (ulong)uVar3;
          do {
            uVar5 = (long)(uVar6 + uVar4) / 2;
            if (node->index[uVar5] < lVar1) {
              uVar6 = uVar5 + 1;
              uVar5 = uVar4;
            }
            uVar4 = uVar5;
          } while (uVar5 != uVar6);
        }
        if (lVar1 == node->index[uVar5]) {
          uVar3 = get_item_for_cursor(node->indexed_child[uVar5],depth + 1,cursor,item);
          pvVar2 = (void *)(ulong)uVar3;
          if (item != (void **)0x0) goto LAB_00160e1d;
        }
      }
      if (node->all_children != (coda_tree_node *)0x0) {
        uVar3 = get_item_for_cursor(node->all_children,depth + 1,cursor,item);
        pvVar2 = (void *)(ulong)uVar3;
        if (item != (void **)0x0) goto LAB_00160e1d;
      }
      goto LAB_00160e18;
    }
    if ((long)node->num_items < 1) goto LAB_00160e18;
    pvVar2 = node->item[(long)node->num_items + -1];
  }
  *item = pvVar2;
LAB_00160e1d:
  return (int)pvVar2;
}

Assistant:

static int get_item_for_cursor(coda_tree_node *node, int depth, coda_cursor *cursor, void **item)
{
    if (node == NULL)
    {
        *item = NULL;
        return 0;
    }

    if (depth < cursor->n - 1)
    {
        /* specific indexed array elements take precedence over an 'all array elements' reference */
        if (node->num_indexed_children > 0)
        {
            long bottom = 0;
            long top = node->num_indexed_children - 1;
            long index = cursor->stack[depth + 1].index;

            while (top != bottom)
            {
                long middle = (bottom + top) / 2;

                if (index <= node->index[middle])
                {
                    top = middle;
                }
                if (index > node->index[middle])
                {
                    bottom = middle + 1;
                }
            }
            if (index == node->index[top])
            {
                if (get_item_for_cursor(node->indexed_child[top], depth + 1, cursor, item) != 0)
                {
                    return -1;
                }
                if (item != NULL)
                {
                    return 0;
                }
            }
        }
        if (node->all_children != NULL)
        {
            if (get_item_for_cursor(node->all_children, depth + 1, cursor, item) != 0)
            {
                return -1;
            }
            if (item != NULL)
            {
                return 0;
            }
        }
    }
    else if (node->num_items > 0)
    {
        /* return the last item in the list */
        *item = node->item[node->num_items - 1];
        return 0;
    }

    /* nothing found */
    *item = NULL;
    return 0;
}